

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void ecs_dump_world_stats(ecs_world_t *world,ecs_world_stats_t *s)

{
  int iVar1;
  
  iVar1 = s->t;
  printf("%s: %*s %.2f\n",(double)(s->frame_count_total).rate.avg[iVar1],"Frame",0x1b,"");
  puts("-------------------------------------");
  printf("%s: %*s %.2f\n",(double)(s->pipeline_build_count_total).rate.avg[iVar1],
         "pipeline rebuilds",0xf,"");
  printf("%s: %*s %.2f\n",(double)(s->systems_ran_frame).rate.avg[iVar1],"systems ran last frame",10
         ,"");
  putchar(10);
  printf("%s: %*s %.2f\n",(double)(world->stats).target_fps,"target FPS",0x16,"");
  printf("%s: %*s %.2f\n",(double)(world->stats).time_scale,"time scale",0x16,"");
  putchar(10);
  printf("%s: %*s %.2f\n",(double)(s->fps).avg[iVar1],"actual FPS",0x16,"");
  printf("%s: %*s %.2f\n",(double)(s->frame_time_total).rate.avg[iVar1],"frame time",0x16,"");
  printf("%s: %*s %.2f\n",(double)(s->system_time_total).rate.avg[iVar1],"system time",0x15,"");
  printf("%s: %*s %.2f\n",(double)(s->merge_time_total).rate.avg[iVar1],"merge time",0x16,"");
  printf("%s: %*s %.2f\n",(double)(s->world_time_total).rate.avg[iVar1],"simulation time elapsed",9,
         "");
  putchar(10);
  printf("%s: %*s %.2f\n",(double)(s->entity_count).avg[iVar1],"entity count",0x14,"");
  printf("%s: %*s %.2f\n",(double)(s->component_count).avg[iVar1],"component count",0x11,"");
  printf("%s: %*s %.2f\n",(double)(s->query_count).avg[iVar1],"query count",0x15,"");
  printf("%s: %*s %.2f\n",(double)(s->system_count).avg[iVar1],"system count",0x14,"");
  printf("%s: %*s %.2f\n",(double)(s->table_count).avg[iVar1],"table count",0x15,"");
  printf("%s: %*s %.2f\n",(double)(s->singleton_table_count).avg[iVar1],"singleton table count",0xb,
         "");
  printf("%s: %*s %.2f\n",(double)(s->empty_table_count).avg[iVar1],"empty table count",0xf,"");
  putchar(10);
  printf("%s: %*s %.2f\n",(double)(s->new_count).rate.avg[iVar1],"deferred new operations",9,"");
  printf("%s: %*s %.2f\n",(double)(s->bulk_new_count).rate.avg[iVar1],"deferred bulk_new operations"
         ,4,"");
  printf("%s: %*s %.2f\n",(double)(s->delete_count).rate.avg[iVar1],"deferred delete operations",6,
         "");
  printf("%s: %*s %.2f\n",(double)(s->clear_count).rate.avg[iVar1],"deferred clear operations",7,"")
  ;
  printf("%s: %*s %.2f\n",(double)(s->add_count).rate.avg[iVar1],"deferred add operations",9,"");
  printf("%s: %*s %.2f\n",(double)(s->remove_count).rate.avg[iVar1],"deferred remove operations",6,
         "");
  printf("%s: %*s %.2f\n",(double)(s->set_count).rate.avg[iVar1],"deferred set operations",9,"");
  printf("%s: %*s %.2f\n",(double)(s->discard_count).rate.avg[iVar1],"discarded operations",0xc,"");
  putchar(10);
  return;
}

Assistant:

void ecs_dump_world_stats(
    ecs_world_t *world,
    const ecs_world_stats_t *s)
{
    int32_t t = s->t;
    
    print_counter("Frame", t, &s->frame_count_total);
    printf("-------------------------------------\n");
    print_counter("pipeline rebuilds", t, &s->pipeline_build_count_total);
    print_counter("systems ran last frame", t, &s->systems_ran_frame);
    printf("\n");
    print_value("target FPS", world->stats.target_fps);
    print_value("time scale", world->stats.time_scale);
    printf("\n");
    print_gauge("actual FPS", t, &s->fps);
    print_counter("frame time", t, &s->frame_time_total);
    print_counter("system time", t, &s->system_time_total);
    print_counter("merge time", t, &s->merge_time_total);
    print_counter("simulation time elapsed", t, &s->world_time_total);
    printf("\n");
    print_gauge("entity count", t, &s->entity_count);
    print_gauge("component count", t, &s->component_count);
    print_gauge("query count", t, &s->query_count);
    print_gauge("system count", t, &s->system_count);
    print_gauge("table count", t, &s->table_count);
    print_gauge("singleton table count", t, &s->singleton_table_count);
    print_gauge("empty table count", t, &s->empty_table_count);
    printf("\n");
    print_counter("deferred new operations", t, &s->new_count);
    print_counter("deferred bulk_new operations", t, &s->bulk_new_count);
    print_counter("deferred delete operations", t, &s->delete_count);
    print_counter("deferred clear operations", t, &s->clear_count);
    print_counter("deferred add operations", t, &s->add_count);
    print_counter("deferred remove operations", t, &s->remove_count);
    print_counter("deferred set operations", t, &s->set_count);
    print_counter("discarded operations", t, &s->discard_count);
    printf("\n");
}